

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infomessages.cpp
# Opt level: O0

void __thiscall CInfoMessages::RenderKillMsg(CInfoMessages *this,CInfoMsg *pInfoMsg,float x,float y)

{
  CUI *pCVar1;
  ITextRender *pIVar2;
  IGraphics *pIVar3;
  CRenderTools *pCVar4;
  vec2 CursorPosition;
  CAnimState *TextColor;
  vec4 *BgColor;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float in_XMM1_Da;
  vec2 in_stack_00000030;
  vec2 in_stack_00000038;
  float AdvanceID_1;
  float Size_1;
  float Size;
  float AdvanceID;
  float VictimNameW;
  float KillerNameW;
  float FontSize;
  CQuadItem QuadItem_1;
  CQuadItem QuadItem;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  undefined8 in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  CRenderTools *in_stack_fffffffffffffec8;
  CDataSprite *in_stack_fffffffffffffed0;
  vec4 *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  CUI *in_stack_fffffffffffffee8;
  vec2 in_stack_fffffffffffffef0;
  vector4_base<float> local_a4;
  anon_union_4_2_94730039_for_vector4_base<float>_5 in_stack_ffffffffffffff74;
  CTeeRenderInfo *in_stack_ffffffffffffff78;
  CAnimState *in_stack_ffffffffffffff80;
  CRenderTools *in_stack_ffffffffffffff88;
  CQuadItem local_6c;
  uint local_5c;
  uint local_58;
  vector2_base<float> local_54;
  vector2_base<float> local_4c;
  CQuadItem local_44;
  uint local_34;
  vector4_base<float> local_30;
  vector4_base<float> local_20;
  vector2_base<float> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fVar5 = CTextCursor::Width((CTextCursor *)(in_RSI + 0x118));
  pCVar1 = CComponent::UI((CComponent *)0x16b42a);
  fVar6 = CUI::GetClientIDRectWidth(pCVar1,36.0);
  fVar7 = CTextCursor::Width((CTextCursor *)(in_RSI + 0x10));
  pCVar1 = CComponent::UI((CComponent *)0x16b472);
  fVar8 = CUI::GetClientIDRectWidth(pCVar1,36.0);
  fVar7 = in_XMM0_Da - (fVar7 + fVar8);
  CComponent::UI((CComponent *)0x16b4c2);
  vector2_base<float>::vector2_base(&local_10,fVar7,in_XMM1_Da);
  vector4_base<float>::vector4_base(&local_20,1.0,1.0,1.0,0.5);
  vector4_base<float>::vector4_base(&local_30,0.1,0.1,0.1,1.0);
  CUI::DrawClientID(in_stack_fffffffffffffee8,(float)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                    in_stack_fffffffffffffef0,(int)in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffed8,(vec4 *)in_stack_fffffffffffffed0);
  CTextCursor::MoveTo((CTextCursor *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                      in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  pIVar2 = CComponent::TextRender((CComponent *)0x16b5be);
  (*(pIVar2->super_IInterface)._vptr_IInterface[0x10])(0x3f800000,pIVar2,in_RSI + 0x10,0,0xffffffff)
  ;
  fVar7 = fVar7 - 24.0;
  if (((*(uint *)(*(long *)(in_RDI + 8) + 0x1b15c) & 2) != 0) &&
     ((*(uint *)(in_RSI + 0x220) & 1) != 0)) {
    pIVar3 = CComponent::Graphics((CComponent *)0x16b642);
    (*(pIVar3->super_IInterface)._vptr_IInterface[8])();
    pIVar3 = CComponent::Graphics((CComponent *)0x16b655);
    local_34 = g_pData->m_aImages[1].m_Id.m_Id;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,(ulong)local_34);
    pIVar3 = CComponent::Graphics((CComponent *)0x16b68a);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x17])();
    if (*(int *)(in_RSI + 8) == *(int *)(in_RSI + 0x224)) {
      CComponent::RenderTools((CComponent *)0x16b6bb);
      CRenderTools::SelectSprite
                ((CRenderTools *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
                 in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
    }
    else {
      CComponent::RenderTools((CComponent *)0x16b6dd);
      CRenderTools::SelectSprite
                ((CRenderTools *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
                 in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
    }
    IGraphics::CQuadItem::CQuadItem(&local_44,fVar7,in_XMM1_Da - 16.0,28.0,56.0);
    pIVar3 = CComponent::Graphics((CComponent *)0x16b757);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_44,1);
    pIVar3 = CComponent::Graphics((CComponent *)0x16b77a);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x18])();
  }
  pCVar4 = CComponent::RenderTools((CComponent *)0x16b792);
  pCVar1 = (CUI *)CAnimState::GetIdle();
  CursorPosition = (vec2)(in_RSI + 0x78);
  vector2_base<float>::vector2_base(&local_4c,-1.0,0.0);
  vector2_base<float>::vector2_base(&local_54,fVar7,in_XMM1_Da + 28.0);
  CRenderTools::RenderTee
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (int)in_stack_ffffffffffffff74,in_stack_00000038,in_stack_00000030);
  if (-1 < *(int *)(in_RSI + 0x21c)) {
    pIVar3 = CComponent::Graphics((CComponent *)0x16b87b);
    local_58 = g_pData->m_aImages[1].m_Id.m_Id;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,(ulong)local_58);
    pIVar3 = CComponent::Graphics((CComponent *)0x16b8b0);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x17])();
    CComponent::RenderTools((CComponent *)0x16b8c6);
    CRenderTools::SelectSprite
              ((CRenderTools *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),(int)in_stack_fffffffffffffec8,
               (int)in_stack_fffffffffffffec4);
    CComponent::RenderTools((CComponent *)0x16b90c);
    CRenderTools::DrawSprite
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
               (float)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    pIVar3 = CComponent::Graphics((CComponent *)0x16b940);
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x18])();
  }
  fVar7 = ((fVar7 - 32.0) - 44.0) - 52.0;
  if (*(int *)(in_RSI + 8) != *(int *)(in_RSI + 0x114)) {
    if (((*(uint *)(*(long *)(in_RDI + 8) + 0x1b15c) & 2) != 0) &&
       ((*(uint *)(in_RSI + 0x220) & 2) != 0)) {
      pIVar3 = CComponent::Graphics((CComponent *)0x16b9c8);
      (*(pIVar3->super_IInterface)._vptr_IInterface[8])();
      pIVar3 = CComponent::Graphics((CComponent *)0x16b9db);
      local_5c = g_pData->m_aImages[1].m_Id.m_Id;
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,(ulong)local_5c);
      pIVar3 = CComponent::Graphics((CComponent *)0x16ba10);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x17])();
      if (*(int *)(in_RSI + 0x114) == *(int *)(in_RSI + 0x224)) {
        CComponent::RenderTools((CComponent *)0x16ba44);
        CRenderTools::SelectSprite
                  ((CRenderTools *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
      }
      else {
        CComponent::RenderTools((CComponent *)0x16ba68);
        CRenderTools::SelectSprite
                  ((CRenderTools *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(int)in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0);
      }
      IGraphics::CQuadItem::CQuadItem(&local_6c,fVar7 - 56.0,in_XMM1_Da - 16.0,28.0,56.0);
      pIVar3 = CComponent::Graphics((CComponent *)0x16baf0);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_6c,1);
      pIVar3 = CComponent::Graphics((CComponent *)0x16bb13);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x18])();
    }
    fVar7 = fVar7 + -24.0;
    CComponent::RenderTools((CComponent *)0x16bb49);
    TextColor = CAnimState::GetIdle();
    BgColor = (vec4 *)(in_RSI + 0x180);
    vector2_base<float>::vector2_base((vector2_base<float> *)&stack0xffffffffffffff8c,1.0,0.0);
    vector2_base<float>::vector2_base
              ((vector2_base<float> *)&stack0xffffffffffffff84,fVar7,in_XMM1_Da + 28.0);
    CRenderTools::RenderTee
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (int)in_stack_ffffffffffffff74,in_stack_00000038,in_stack_00000030);
    if (-1 < *(int *)(in_RSI + 0x114)) {
      CComponent::UI((CComponent *)0x16bc35);
      vector2_base<float>::vector2_base
                ((vector2_base<float> *)&stack0xffffffffffffff7c,(fVar7 - 32.0) - (fVar5 + fVar6),
                 in_XMM1_Da);
      fVar5 = 1.0;
      vector4_base<float>::vector4_base
                ((vector4_base<float> *)&stack0xffffffffffffff6c,1.0,1.0,1.0,0.5);
      vector4_base<float>::vector4_base(&local_a4,0.1,0.1,0.1,fVar5);
      CUI::DrawClientID(pCVar1,(float)((ulong)pCVar4 >> 0x20),CursorPosition,(int)pCVar4,BgColor,
                        (vec4 *)TextColor);
      CTextCursor::MoveTo((CTextCursor *)CONCAT44(fVar5,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
      pIVar2 = CComponent::TextRender((CComponent *)0x16bd34);
      (*(pIVar2->super_IInterface)._vptr_IInterface[0x10])
                (0x3f800000,pIVar2,in_RSI + 0x118,0,0xffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CInfoMessages::RenderKillMsg(CInfoMsg *pInfoMsg, float x, float y) const
{
	float FontSize = 36.0f;
	float KillerNameW = pInfoMsg->m_Player2NameCursor.Width() + UI()->GetClientIDRectWidth(FontSize);
	float VictimNameW = pInfoMsg->m_Player1NameCursor.Width() + UI()->GetClientIDRectWidth(FontSize);

	// render victim name
	x -= VictimNameW;
	float AdvanceID = UI()->DrawClientID(pInfoMsg->m_Player1NameCursor.m_FontSize, vec2(x, y), pInfoMsg->m_Player1ID);
	pInfoMsg->m_Player1NameCursor.MoveTo(x + AdvanceID, y);
	TextRender()->DrawTextOutlined(&pInfoMsg->m_Player1NameCursor);

	// render victim tee
	x -= 24.0f;

	if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_FLAGS)
	{
		if(pInfoMsg->m_ModeSpecial&1)
		{
			Graphics()->BlendNormal();
			Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
			Graphics()->QuadsBegin();

			if(pInfoMsg->m_Player1ID == pInfoMsg->m_FlagCarrierBlue)
				RenderTools()->SelectSprite(SPRITE_FLAG_BLUE);
			else
				RenderTools()->SelectSprite(SPRITE_FLAG_RED);

			float Size = 56.0f;
			IGraphics::CQuadItem QuadItem(x, y-16, Size/2, Size);
			Graphics()->QuadsDrawTL(&QuadItem, 1);
			Graphics()->QuadsEnd();
		}
	}

	RenderTools()->RenderTee(CAnimState::GetIdle(), &pInfoMsg->m_Player1RenderInfo, EMOTE_PAIN, vec2(-1,0), vec2(x, y+28));
	x -= 32.0f;

	// render weapon
	x -= 44.0f;
	if(pInfoMsg->m_Weapon >= 0)
	{
		Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
		Graphics()->QuadsBegin();
		RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[pInfoMsg->m_Weapon].m_pSpriteBody);
		RenderTools()->DrawSprite(x, y+28, 96);
		Graphics()->QuadsEnd();
	}
	x -= 52.0f;

	if(pInfoMsg->m_Player1ID != pInfoMsg->m_Player2ID)
	{
		if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_FLAGS)
		{
			if(pInfoMsg->m_ModeSpecial&2)
			{
				Graphics()->BlendNormal();
				Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
				Graphics()->QuadsBegin();

				if(pInfoMsg->m_Player2ID == pInfoMsg->m_FlagCarrierBlue)
					RenderTools()->SelectSprite(SPRITE_FLAG_BLUE, SPRITE_FLAG_FLIP_X);
				else
					RenderTools()->SelectSprite(SPRITE_FLAG_RED, SPRITE_FLAG_FLIP_X);

				float Size = 56.0f;
				IGraphics::CQuadItem QuadItem(x-56, y-16, Size/2, Size);
				Graphics()->QuadsDrawTL(&QuadItem, 1);
				Graphics()->QuadsEnd();
			}
		}

		// render killer tee
		x -= 24.0f;
		RenderTools()->RenderTee(CAnimState::GetIdle(), &pInfoMsg->m_Player2RenderInfo, EMOTE_ANGRY, vec2(1,0), vec2(x, y+28));
		x -= 32.0f;

		if(pInfoMsg->m_Player2ID >= 0)
		{
			// render killer name
			x -= KillerNameW;
			float AdvanceID = UI()->DrawClientID(pInfoMsg->m_Player2NameCursor.m_FontSize, vec2(x, y), pInfoMsg->m_Player2ID);
			pInfoMsg->m_Player2NameCursor.MoveTo(x + AdvanceID, y);
			TextRender()->DrawTextOutlined(&pInfoMsg->m_Player2NameCursor);
		}
	}
}